

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-close-stdout-read-stdin.c
# Opt level: O0

int run_test_pipe_close_stdout_read_stdin(void)

{
  int iVar1;
  ssize_t sVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  undefined1 local_128 [8];
  uv_pipe_t stdin_pipe;
  int iStack_18;
  char buf;
  int status;
  int fd [2];
  int pid;
  int r;
  
  fd[1] = -1;
  fd[1] = pipe(&stack0xffffffffffffffe8);
  if (fd[1] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-close-stdout-read-stdin.c"
            ,0x3c,"r == 0");
    abort();
  }
  fd[0] = fork();
  if (fd[0] == 0) {
    close(status);
    sVar2 = read(iStack_18,(void *)((long)&stdin_pipe.pipe_fname + 3),1);
    fd[1] = (int)sVar2;
    if ((fd[1] < -1) || (1 < fd[1])) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x46,"-1 <= r && r <= 1");
      abort();
    }
    close(0);
    fd[1] = dup(iStack_18);
    if (fd[1] == -1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x49,"r != -1");
      abort();
    }
    uVar3 = uv_default_loop();
    fd[1] = uv_pipe_init(uVar3,local_128,0);
    if (fd[1] != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x4d,"r == 0");
      abort();
    }
    fd[1] = uv_pipe_open(local_128,0);
    if (fd[1] != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x50,"r == 0");
      abort();
    }
    fd[1] = uv_read_start(local_128,alloc_buffer,read_stdin);
    if (fd[1] != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x53,"r == 0");
      abort();
    }
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x5a,"uv_run(uv_default_loop(), UV_RUN_NOWAIT) == 0");
      abort();
    }
  }
  else {
    close(status);
    close(iStack_18);
    waitpid(fd[0],(int *)((long)&stdin_pipe.pipe_fname + 4),0);
    if (((stdin_pipe.pipe_fname._4_4_ & 0x7f) != 0) ||
       ((int)(stdin_pipe.pipe_fname._4_4_ & 0xff00) >> 8 != 0)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-close-stdout-read-stdin.c"
              ,0x65,"WIFEXITED(status) && WEXITSTATUS(status) == 0");
      abort();
    }
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-close-stdout-read-stdin.c"
          ,0x68,"0 == uv_loop_close(uv_default_loop())");
  abort();
}

Assistant:

TEST_IMPL(pipe_close_stdout_read_stdin) {
  int r = -1;
  int pid;
  int fd[2];
  int status;
  char buf;
  uv_pipe_t stdin_pipe;

  r = pipe(fd);
  ASSERT(r == 0);

  if ((pid = fork()) == 0) {
    /*
     * Make the read side of the pipe our stdin.
     * The write side will be closed by the parent process.
    */
    close(fd[1]);
    /* block until write end of pipe is closed */
    r = read(fd[0], &buf, 1);
    ASSERT(-1 <= r && r <= 1);
    close(0);
    r = dup(fd[0]);
    ASSERT(r != -1);

    /* Create a stream that reads from the pipe. */
    r = uv_pipe_init(uv_default_loop(), (uv_pipe_t *)&stdin_pipe, 0);
    ASSERT(r == 0);

    r = uv_pipe_open((uv_pipe_t *)&stdin_pipe, 0);
    ASSERT(r == 0);

    r = uv_read_start((uv_stream_t *)&stdin_pipe, alloc_buffer, read_stdin);
    ASSERT(r == 0);

    /*
     * Because the other end of the pipe was closed, there should
     * be no event left to process after one run of the event loop.
     * Otherwise, it means that events were not processed correctly.
     */
    ASSERT(uv_run(uv_default_loop(), UV_RUN_NOWAIT) == 0);
  } else {
    /*
     * Close both ends of the pipe so that the child
     * get a POLLHUP event when it tries to read from
     * the other end.
     */
     close(fd[1]);
     close(fd[0]);

    waitpid(pid, &status, 0);
    ASSERT(WIFEXITED(status) && WEXITSTATUS(status) == 0);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}